

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

bool __thiscall QToolButtonPrivate::hasMenu(QToolButtonPrivate *this)

{
  bool bVar1;
  QMenu *pQVar2;
  
  if ((this->defaultAction != (QAction *)0x0) &&
     (pQVar2 = QAction::menu<QMenu*>(this->defaultAction), pQVar2 != (QMenu *)0x0)) {
    return true;
  }
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->menuAction);
  if ((bVar1) &&
     (pQVar2 = QAction::menu<QMenu*>((QAction *)(this->menuAction).wp.value), pQVar2 != (QMenu *)0x0
     )) {
    return true;
  }
  return (ulong)(this->defaultAction != (QAction *)0x0) <
         (ulong)(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.size;
}

Assistant:

bool QToolButtonPrivate::hasMenu() const
{
    return ((defaultAction && defaultAction->menu())
            || (menuAction && menuAction->menu())
            || actions.size() > (defaultAction ? 1 : 0));
}